

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_bn2lebinpad(BIGNUM *a,uchar *to,int tolen)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  
  iVar2 = BN_num_bits((BIGNUM *)a);
  uVar1 = (long)(iVar2 + 7) / 8;
  uVar4 = uVar1 & 0xffffffff;
  iVar2 = (int)uVar1;
  if (tolen < iVar2) {
    tolen = -1;
  }
  else {
    if (tolen - iVar2 != 0 && iVar2 <= tolen) {
      memset(to + iVar2,0,(long)(tolen - iVar2));
    }
    puVar5 = to + iVar2;
    while( true ) {
      puVar5 = puVar5 + -1;
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
      if (uVar3 == 0xffffffff) break;
      *puVar5 = (uchar)(a->d[(int)uVar3 / 8] >> ((char)((int)uVar3 % 8) * '\b' & 0x3fU));
    }
  }
  return tolen;
}

Assistant:

int BN_bn2lebinpad(const BIGNUM *a, unsigned char *to, int tolen)
{
    int i;
    BN_ULONG l;
    bn_check_top(a);
    i = BN_num_bytes(a);
    if (tolen < i)
        return -1;
    /* Add trailing zeroes if necessary */
    if (tolen > i)
        memset(to + i, 0, tolen - i);
    to += i;
    while (i--) {
        l = a->d[i / BN_BYTES];
        to--;
        *to = (unsigned char)(l >> (8 * (i % BN_BYTES))) & 0xff;
    }
    return tolen;
}